

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_state_machine_cache.cpp
# Opt level: O3

StateMachine * __thiscall
duckdb::CSVStateMachineCache::Get
          (CSVStateMachineCache *this,CSVStateMachineOptions *state_machine_options)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->main_mutex);
  if (iVar1 == 0) {
    iVar2 = ::std::
            _Hashtable<duckdb::CSVStateMachineOptions,_std::pair<const_duckdb::CSVStateMachineOptions,_duckdb::StateMachine>,_std::allocator<std::pair<const_duckdb::CSVStateMachineOptions,_duckdb::StateMachine>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::CSVStateMachineOptions>,_duckdb::HashCSVStateMachineConfig,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->state_machine_cache)._M_h,state_machine_options);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_duckdb::CSVStateMachineOptions,_duckdb::StateMachine>,_false>
        ._M_cur == (__node_type *)0x0) {
      Insert(this,state_machine_options);
    }
    pmVar3 = ::std::__detail::
             _Map_base<duckdb::CSVStateMachineOptions,_std::pair<const_duckdb::CSVStateMachineOptions,_duckdb::StateMachine>,_std::allocator<std::pair<const_duckdb::CSVStateMachineOptions,_duckdb::StateMachine>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::CSVStateMachineOptions>,_duckdb::HashCSVStateMachineConfig,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::CSVStateMachineOptions,_std::pair<const_duckdb::CSVStateMachineOptions,_duckdb::StateMachine>,_std::allocator<std::pair<const_duckdb::CSVStateMachineOptions,_duckdb::StateMachine>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::CSVStateMachineOptions>,_duckdb::HashCSVStateMachineConfig,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->state_machine_cache,state_machine_options);
    pthread_mutex_unlock((pthread_mutex_t *)&this->main_mutex);
    return pmVar3;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

const StateMachine &CSVStateMachineCache::Get(const CSVStateMachineOptions &state_machine_options) {
	// Custom State Machine, we need to create it and cache it first
	lock_guard<mutex> parallel_lock(main_mutex);
	if (state_machine_cache.find(state_machine_options) == state_machine_cache.end()) {
		Insert(state_machine_options);
	}
	const auto &transition_array = state_machine_cache[state_machine_options];
	return transition_array;
}